

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Revision.cpp
# Opt level: O0

string * __thiscall OpenMD::Revision::getBuildDate_abi_cxx11_(Revision *this)

{
  string *in_RDI;
  string *d;
  
  std::__cxx11::string::string((string *)in_RDI);
  std::__cxx11::string::assign((char *)in_RDI);
  std::__cxx11::string::append((char *)in_RDI);
  return in_RDI;
}

Assistant:

std::string Revision::getBuildDate() {
    std::string d;
    d.assign("Build date: ");
    d.append(build_date);
    return d;
  }